

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O1

uint16_t Unpack16(uint8_t *p,size_t offset)

{
  long lVar1;
  ushort uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  do {
    uVar2 = (ushort)p[lVar1 + offset] | uVar2 << 8;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 == 1);
  return uVar2;
}

Assistant:

uint16_t Unpack16(const uint8_t* p, size_t offset)
{
    uint16_t rc = 0;
    for (int i = 0; i < 2; i++)
    {
        rc <<= 8;
        rc |= p[offset++];
    }
    return rc;
}